

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void simple_motion_search_based_split
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PartitionSearchState *part_state)

{
  ExtPartController *ext_part_controller;
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  _Bool _Var7;
  int idx;
  float *pfVar8;
  aom_partition_features_before_none_t *paVar9;
  BLOCK_SIZE bsize;
  long lVar10;
  long lVar11;
  long lVar13;
  byte bVar14;
  float mi_col;
  float features [17];
  aom_partition_features_t features_1;
  float score;
  int local_64;
  int iStack_60;
  undefined8 uStack_5c;
  int local_54;
  int *piVar12;
  
  bVar14 = 0;
  bsize = (part_state->part_blk_params).bsize;
  switch(bsize) {
  case BLOCK_16X16:
    lVar13 = 3;
    break;
  case BLOCK_32X32:
    lVar13 = 2;
    break;
  case BLOCK_64X64:
    lVar13 = 1;
    break;
  case BLOCK_128X128:
    lVar13 = 0;
    break;
  default:
    if (bsize == BLOCK_8X8) {
      lVar13 = 4;
      break;
    }
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
    lVar13 = -1;
  }
  iVar2 = (cpi->common).width;
  iVar3 = (cpi->common).height;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  iVar2 = (cpi->sf).part_sf.simple_motion_search_prune_agg;
  if ((long)iVar2 != -1) {
    piVar12 = &DAT_004e2e38;
    if (iVar2 < 4) {
      piVar12 = quad_to_linear_1 + iVar2;
    }
    lVar11 = (long)*piVar12;
    if (-1 < lVar11) {
      iVar2 = (&av1_simple_motion_search_split_mean_rel)[lVar13];
      iVar4 = (&av1_simple_motion_search_split_std_rel)[lVar13];
      iVar5 = (&av1_simple_motion_search_split_nn_config_rel)[lVar13];
      lVar10 = (ulong)(0x1df < iVar3) + (ulong)(0x2cf < iVar3);
      lVar6 = (ulong)(uint)((int)lVar10 * 4) * 5;
      fVar1 = *(float *)((long)av1_simple_motion_search_split_thresh[lVar11][0] + lVar13 * 4 + lVar6
                        );
      mi_col = *(float *)((long)av1_simple_motion_search_no_split_thresh[lVar11][0] +
                         lVar13 * 4 + lVar6);
      features[0xc] = 0.0;
      features[0xd] = 0.0;
      features[0xe] = 0.0;
      features[0xf] = 0.0;
      features[8] = 0.0;
      features[9] = 0.0;
      features[10] = 0.0;
      features[0xb] = 0.0;
      features[4] = 0.0;
      features[5] = 0.0;
      features[6] = 0.0;
      features[7] = 0.0;
      features[0] = 0.0;
      features[1] = 0.0;
      features[2] = 0.0;
      features[3] = 0.0;
      features[0x10] = 0.0;
      simple_motion_search_prune_part_features
                (cpi,x,sms_tree,(part_state->part_blk_params).mi_row,
                 (part_state->part_blk_params).mi_col,bsize,features,3);
      write_features_to_file
                ((cpi->oxcf).partition_info_path,(cpi->ext_part_controller).test_mode != 0,features,
                 0x11,0,bsize,(int)cpi,(int)mi_col);
      if ((cpi->ext_part_controller).ready != 0) {
        ext_part_controller = &cpi->ext_part_controller;
        features_1.id = AOM_EXT_PART_FEATURE_BEFORE_NONE;
        pfVar8 = features;
        paVar9 = &features_1.before_part_none;
        for (lVar11 = 0x11; lVar11 != 0; lVar11 = lVar11 + -1) {
          paVar9->f[0] = *pfVar8;
          pfVar8 = pfVar8 + (ulong)bVar14 * -2 + 1;
          paVar9 = (aom_partition_features_before_none_t *)((long)paVar9 + (ulong)bVar14 * -8 + 4);
        }
        av1_ext_part_send_features(ext_part_controller,&features_1);
        _Var7 = av1_ext_part_get_partition_decision
                          (ext_part_controller,(aom_partition_decision_t *)&score);
        if (_Var7) {
          part_state->partition_none_allowed = local_64;
          part_state->partition_rect_allowed[0] = iStack_60;
          *(undefined8 *)(part_state->partition_rect_allowed + 1) = uStack_5c;
          part_state->do_square_split = local_54;
          return;
        }
      }
      lVar11 = 0;
      do {
        features[lVar11] =
             (features[lVar11] -
             *(float *)((long)&av1_simple_motion_search_split_mean_rel + lVar11 * 4 + (long)iVar2))
             / *(float *)((long)&av1_simple_motion_search_split_std_rel + (long)iVar4 + lVar11 * 4);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x11);
      score = 0.0;
      (*av1_nn_predict)(features,(NN_CONFIG *)
                                 ((long)&av1_simple_motion_search_split_nn_config_rel + (long)iVar5)
                        ,1,&score);
      if (fVar1 < score) {
        part_state->do_square_split = 1;
        part_state->partition_none_allowed = 0;
        part_state->partition_rect_allowed[0] = 0;
        *(undefined8 *)(part_state->partition_rect_allowed + 1) = 0;
      }
      if ((1 < (cpi->sf).part_sf.simple_motion_search_split) && (score < mi_col)) {
        part_state->do_square_split = 0;
      }
      lVar11 = (long)(cpi->sf).part_sf.simple_motion_search_rect_split;
      if ((lVar11 != 0) &&
         (score < *(float *)(&DAT_00502920 + (ulong)(0x2cf < iVar3) * 4) *
                  av1_simple_motion_search_no_split_thresh[lVar11][lVar10][lVar13])) {
        part_state->do_rectangular_split = 0;
      }
    }
  }
  return;
}

Assistant:

static void simple_motion_search_based_split(AV1_COMP *const cpi, MACROBLOCK *x,
                                             SIMPLE_MOTION_DATA_TREE *sms_tree,
                                             PartitionSearchState *part_state) {
  const AV1_COMMON *const cm = &cpi->common;
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  const int bsize_idx = convert_bsize_to_idx(bsize);
  const int is_720p_or_larger = AOMMIN(cm->width, cm->height) >= 720;
  const int is_480p_or_larger = AOMMIN(cm->width, cm->height) >= 480;
  // res_idx is 0 for res < 480p, 1 for 480p, 2 for 720p+
  const int res_idx = is_480p_or_larger + is_720p_or_larger;

  assert(bsize_idx >= 0 && bsize_idx <= 4 &&
         "Invalid bsize in simple_motion_search_based_split");

  const float *ml_mean = av1_simple_motion_search_split_mean[bsize_idx];
  const float *ml_std = av1_simple_motion_search_split_std[bsize_idx];
  const NN_CONFIG *nn_config =
      av1_simple_motion_search_split_nn_config[bsize_idx];

  const int agg = get_simple_motion_search_prune_agg(
      x->qindex, cpi->sf.part_sf.simple_motion_search_prune_agg, 0);
  if (agg < 0) {
    return;
  }

  const float split_only_thresh =
      av1_simple_motion_search_split_thresh[agg][res_idx][bsize_idx];
  const float no_split_thresh =
      av1_simple_motion_search_no_split_thresh[agg][res_idx][bsize_idx];

  float features[FEATURE_SIZE_SMS_SPLIT] = { 0.0f };
  simple_motion_search_prune_part_features(cpi, x, sms_tree, mi_row, mi_col,
                                           bsize, features,
                                           FEATURE_SMS_SPLIT_MODEL_FLAG);

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         FEATURE_SIZE_SMS_SPLIT, 0, bsize, mi_row, mi_col);

  // Note: it is intended to not normalize the features here, to keep it
  // consistent for all features collected and passed to the external model.
  if (ext_ml_model_decision_before_none(
          cpi, features, &part_state->partition_none_allowed,
          &part_state->partition_rect_allowed[HORZ],
          &part_state->partition_rect_allowed[VERT],
          &part_state->do_rectangular_split, &part_state->do_square_split)) {
    return;
  }

  for (int idx = 0; idx < FEATURE_SIZE_SMS_SPLIT; idx++) {
    features[idx] = (features[idx] - ml_mean[idx]) / ml_std[idx];
  }

  float score = 0.0f;

  av1_nn_predict(features, nn_config, 1, &score);

  if (score > split_only_thresh) {
    av1_set_square_split_only(part_state);
  }

  if (cpi->sf.part_sf.simple_motion_search_split >= 2 &&
      score < no_split_thresh) {
    av1_disable_square_split_partition(part_state);
  }

  // If the score is very low, prune rectangular split since it is unlikely to
  // occur.
  if (cpi->sf.part_sf.simple_motion_search_rect_split) {
    const float scale = res_idx >= 2 ? 3.0f : 2.0f;
    const float rect_split_thresh =
        scale * av1_simple_motion_search_no_split_thresh
                    [cpi->sf.part_sf.simple_motion_search_rect_split][res_idx]
                    [bsize_idx];
    if (score < rect_split_thresh) {
      part_state->do_rectangular_split = 0;
    }
  }
}